

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O1

ostream * spvtools::utils::operator<<(ostream *out,BitVector *bv)

{
  bool bVar1;
  pointer puVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  char local_39;
  BitVector *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
  puVar2 = (bv->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = bv;
  if ((bv->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    uVar5 = 0;
    do {
      uVar4 = puVar2[uVar5];
      if (uVar4 != 0) {
        do {
          if ((uVar4 & 1) != 0) {
            local_39 = ' ';
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_39,1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          }
          bVar1 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
        } while (bVar1);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      puVar2 = (local_38->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(local_38->bits_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const BitVector& bv) {
  out << "{";
  for (uint32_t i = 0; i < bv.bits_.size(); ++i) {
    BitVector::BitContainer b = bv.bits_[i];
    uint32_t j = 0;
    while (b != 0) {
      if (b & 1) {
        out << ' ' << i * BitVector::kBitContainerSize + j;
      }
      ++j;
      b = b >> 1;
    }
  }
  out << "}";
  return out;
}